

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrtran.c
# Opt level: O0

void png_set_gray_to_rgb(png_structrp png_ptr)

{
  int iVar1;
  png_structrp png_ptr_local;
  
  iVar1 = png_rtran_ok(png_ptr,0);
  if (iVar1 != 0) {
    png_set_expand_gray_1_2_4_to_8(png_ptr);
    png_ptr->transformations = png_ptr->transformations | 0x4000;
  }
  return;
}

Assistant:

void PNGAPI
png_set_gray_to_rgb(png_structrp png_ptr)
{
   png_debug(1, "in png_set_gray_to_rgb");

   if (png_rtran_ok(png_ptr, 0) == 0)
      return;

   /* Because rgb must be 8 bits or more: */
   png_set_expand_gray_1_2_4_to_8(png_ptr);
   png_ptr->transformations |= PNG_GRAY_TO_RGB;
}